

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509cset.cc
# Opt level: O1

int X509_CRL_set1_signature_algo(X509_CRL *crl,X509_ALGOR *algo)

{
  bool bVar1;
  X509_ALGOR *a;
  X509_ALGOR *a_00;
  
  a = X509_ALGOR_dup((X509_ALGOR *)algo);
  a_00 = X509_ALGOR_dup((X509_ALGOR *)algo);
  bVar1 = a_00 != (X509_ALGOR *)0x0 && a != (X509_ALGOR *)0x0;
  if (bVar1) {
    X509_ALGOR_free((X509_ALGOR *)crl->sig_alg);
    crl->sig_alg = (X509_ALGOR *)a;
    X509_ALGOR_free((X509_ALGOR *)crl->crl->sig_alg);
    crl->crl->sig_alg = (X509_ALGOR *)a_00;
  }
  else {
    X509_ALGOR_free(a);
    X509_ALGOR_free(a_00);
  }
  return (uint)bVar1;
}

Assistant:

int X509_CRL_set1_signature_algo(X509_CRL *crl, const X509_ALGOR *algo) {
  X509_ALGOR *copy1 = X509_ALGOR_dup(algo);
  X509_ALGOR *copy2 = X509_ALGOR_dup(algo);
  if (copy1 == NULL || copy2 == NULL) {
    X509_ALGOR_free(copy1);
    X509_ALGOR_free(copy2);
    return 0;
  }

  X509_ALGOR_free(crl->sig_alg);
  crl->sig_alg = copy1;
  X509_ALGOR_free(crl->crl->sig_alg);
  crl->crl->sig_alg = copy2;
  return 1;
}